

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_test.cxx
# Opt level: O3

void test<cryptox::message_digest_algorithm<&EVP_sha1,160ul>>
               (size_t bits,string *key,string *salt,size_t rounds,string *expected)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key_first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  salt_first;
  int iVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string local_100;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  string *local_c0;
  string *local_b8;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  shared_count sStack_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  string **local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  string **local_30;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key_first._M_current = (key->_M_dataplus)._M_p;
  salt_first._M_current = (salt->_M_dataplus)._M_p;
  cryptox::
  pbkdf2<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (key_first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(key_first._M_current + key->_M_string_length),salt_first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(salt_first._M_current + salt->_M_string_length),rounds,&result,bits);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/key_derivation/pbkdf2_test.cxx"
  ;
  local_80 = "";
  last._M_current = (uchar *)&local_98;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x22);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_002e0fe0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  cryptox::
  to_hex<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_100,
             (cryptox *)
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,last);
  if (local_100._M_string_length == expected->_M_string_length) {
    if (local_100._M_string_length == 0) {
      local_b0[0] = true;
    }
    else {
      iVar1 = bcmp(local_100._M_dataplus._M_p,(expected->_M_dataplus)._M_p,
                   local_100._M_string_length);
      local_b0[0] = iVar1 == 0;
    }
  }
  else {
    local_b0[0] = false;
  }
  local_a8 = 0;
  sStack_a0.pi_ = (sp_counted_base *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/key_derivation/pbkdf2_test.cxx"
  ;
  local_70 = "";
  local_30 = &local_b8;
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_002e1030;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_50 = &local_c0;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_002e1030;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = expected;
  local_b8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (local_b0,&local_e0,&local_78,0x22,1,2,2,"to_hex(result)",&local_48,"expected",&local_68
            );
  boost::detail::shared_count::~shared_count(&sStack_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test(
	const size_t       bits,
	const std::string& key,
	const std::string& salt,
	const size_t       rounds,
	const std::string& expected
) {
	std::vector<std::uint8_t> result;

	pbkdf2<Algorithm>(key .begin(), key .end(),
	                  salt.begin(), salt.end(),
	                  rounds,
	                  std::back_inserter(result),
	                  bits);

	BOOST_CHECK_EQUAL(to_hex(result), expected);
}